

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O3

AInventory * __thiscall ASigil::CreateCopy(ASigil *this,AActor *other)

{
  int iVar1;
  AInventory *pAVar2;
  DVector3 local_28;
  
  local_28.X = 0.0;
  local_28.Y = 0.0;
  local_28.Z = 0.0;
  pAVar2 = (AInventory *)
           AActor::StaticSpawn((PClassActor *)RegistrationInfo.MyClass,&local_28,NO_REPLACE,false);
  iVar1 = (this->super_AWeapon).super_AInventory.MaxAmount;
  pAVar2->Amount = (this->super_AWeapon).super_AInventory.Amount;
  pAVar2->MaxAmount = iVar1;
  *(undefined4 *)((long)&pAVar2[1].super_AActor.Angles.CamRoll.Degrees + 4) =
       *(undefined4 *)&(this->super_AWeapon).field_0x584;
  (pAVar2->Icon).texnum = (this->super_AWeapon).super_AInventory.Icon.texnum;
  (*(this->super_AWeapon).super_AInventory.super_AActor.super_DThinker.super_DObject._vptr_DObject
    [0x36])(this);
  return pAVar2;
}

Assistant:

AInventory *ASigil::CreateCopy (AActor *other)
{
	ASigil *copy = Spawn<ASigil> ();
	copy->Amount = Amount;
	copy->MaxAmount = MaxAmount;
	copy->NumPieces = NumPieces;
	copy->Icon = Icon;
	GoAwayAndDie ();
	return copy;
}